

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.hpp
# Opt level: O3

QAction * __thiscall
QtMWidgets::ToolBar::addAction<void(Object::*)()>
          (ToolBar *this,QIcon *icon,Object *receiver,Function slot)

{
  QAction *this_00;
  undefined4 *puVar1;
  undefined8 in_R8;
  QString local_78;
  Object *local_58;
  ToolBar *local_50;
  QObject local_48 [8];
  QSlotObjectBase local_40;
  
  this_00 = (QAction *)operator_new(0x10);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  QAction::QAction(this_00,icon,&local_78,(QObject *)this);
  local_58 = receiver;
  local_50 = this;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  local_78.d.d = (Data *)QAction::triggered;
  local_78.d.ptr = (char16_t *)0x0;
  local_40._0_8_ = slot;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) = QtPrivate::QSlotObject<void_(Object::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(Function *)(puVar1 + 4) = slot;
  *(undefined8 *)(puVar1 + 6) = in_R8;
  QObject::connectImpl
            (local_48,(void **)this_00,(QObject *)&local_78,(void **)local_58,&local_40,
             (ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QWidget::addAction((QAction *)local_50);
  return this_00;
}

Assistant:

inline QAction * addAction( const QIcon & icon,
		const typename QtPrivate::FunctionPointer< Func1 >::Object * receiver,
		Func1 slot )
	{
		QAction * action = new QAction( icon, QString(), this );
		QObject::connect( action, &QAction::triggered, receiver, slot );
		addAction( action );
		return action;
	}